

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SystemTimingCheckSyntax *pSVar1;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *in_stack_000000e0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  deepClone<slang::syntax::TimingCheckArgSyntax>(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SystemTimingCheckSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn,in_stack_00000030);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SystemTimingCheckSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SystemTimingCheckSyntax>(
        *deepClone(node.attributes, alloc),
        node.name.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.args, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}